

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long mkvparser::UnserializeString(IMkvReader *pReader,longlong pos,longlong size,char **str)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  
  if (*str != (char *)0x0) {
    operator_delete__(*str);
  }
  *str = (char *)0x0;
  lVar3 = -2;
  if ((ulong)size < 0x1312d01) {
    pcVar2 = (char *)operator_new__(size + 1,(nothrow_t *)&std::nothrow);
    *str = pcVar2;
    if (pcVar2 != (char *)0x0) {
      iVar1 = (**pReader->_vptr_IMkvReader)(pReader,pos,size,pcVar2);
      pcVar2 = *str;
      if (iVar1 == 0) {
        pcVar2[size] = '\0';
        lVar3 = 0;
      }
      else {
        if (pcVar2 != (char *)0x0) {
          operator_delete__(pcVar2);
        }
        lVar3 = (long)iVar1;
        *str = (char *)0x0;
      }
    }
  }
  return lVar3;
}

Assistant:

long UnserializeString(IMkvReader* pReader, long long pos, long long size,
                       char*& str) {
  delete[] str;
  str = NULL;

  if (size >= LONG_MAX || size < 0 || size > kStringElementSizeLimit)
    return E_FILE_FORMAT_INVALID;

  // +1 for '\0' terminator
  const long required_size = static_cast<long>(size) + 1;

  str = SafeArrayAlloc<char>(1, required_size);
  if (str == NULL)
    return E_FILE_FORMAT_INVALID;

  unsigned char* const buf = reinterpret_cast<unsigned char*>(str);

  const long status = pReader->Read(pos, static_cast<long>(size), buf);

  if (status) {
    delete[] str;
    str = NULL;

    return status;
  }

  str[required_size - 1] = '\0';
  return 0;
}